

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypatia.h
# Opt level: O2

matrix3 * matrix3_multiply(matrix3 *self,matrix3 *mT)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  anon_union_36_5_d0a4420b_for_matrix3_0 local_38;
  
  uVar10 = *(undefined8 *)((long)&self->field_0 + 4);
  uVar11 = *(undefined8 *)((long)&self->field_0 + 0x10);
  uVar12 = *(undefined8 *)((long)&self->field_0 + 0x1c);
  fVar1 = (self->field_0).m[3];
  fVar17 = (float)uVar11;
  fVar18 = (float)((ulong)uVar11 >> 0x20);
  fVar2 = (mT->field_0).m[4];
  fVar3 = (mT->field_0).m[0];
  fVar4 = (mT->field_0).m[1];
  fVar5 = (mT->field_0).m[2];
  fVar6 = (mT->field_0).m[3];
  fVar7 = (self->field_0).m[0];
  fVar13 = (float)uVar10;
  fVar14 = (float)((ulong)uVar10 >> 0x20);
  fVar8 = (self->field_0).m[6];
  fVar15 = (float)uVar12;
  fVar16 = (float)((ulong)uVar12 >> 0x20);
  fVar9 = (mT->field_0).m[5];
  local_38.m[0] = fVar5 * fVar8 + fVar3 * fVar7 + fVar4 * fVar1;
  local_38.m[1] = fVar5 * fVar15 + fVar3 * fVar13 + fVar4 * fVar17;
  local_38.m[2] = fVar5 * fVar16 + fVar3 * fVar14 + fVar4 * fVar18;
  local_38.m[3] = fVar9 * fVar8 + fVar6 * fVar7 + fVar2 * fVar1;
  fVar3 = (mT->field_0).m[6];
  fVar4 = (mT->field_0).m[7];
  fVar5 = (mT->field_0).m[8];
  local_38.m[4] = fVar9 * fVar15 + fVar6 * fVar13 + fVar2 * fVar17;
  local_38.m[6] = fVar5 * fVar8 + fVar3 * fVar7 + fVar4 * fVar1;
  local_38.m[5] = fVar9 * fVar16 + fVar6 * fVar14 + fVar2 * fVar18;
  local_38.m[7] = fVar5 * fVar15 + fVar3 * fVar13 + fVar4 * fVar17;
  local_38.m[8] = fVar16 * fVar5 + fVar14 * fVar3 + fVar18 * fVar4;
  matrix3_set(self,(matrix3 *)&local_38.field_1);
  return self;
}

Assistant:

HYPAPI struct matrix3 *matrix3_multiply(struct matrix3 *self, const struct matrix3 *mT)
{
	/* mT is the multiplicand */

	struct matrix3 r;

	matrix3_identity(&r);

	/* first row */
	r.r00 = self->c00 * mT->c00 + self->c01 * mT->c10 + self->c02 * mT->c20;
	r.r01 = self->c10 * mT->c00 + self->c11 * mT->c10 + self->c12 * mT->c20;
	r.r02 = self->c20 * mT->c00 + self->c21 * mT->c10 + self->c22 * mT->c20;

	/* second row */
	r.r10 = self->c00 * mT->c01 + self->c01 * mT->c11 + self->c02 * mT->c21;
	r.r11 = self->c10 * mT->c01 + self->c11 * mT->c11 + self->c12 * mT->c21;
	r.r12 = self->c20 * mT->c01 + self->c21 * mT->c11 + self->c22 * mT->c21;

	/* third row */
	r.r20 = self->c00 * mT->c02 + self->c01 * mT->c12 + self->c02 * mT->c22;
	r.r21 = self->c10 * mT->c02 + self->c11 * mT->c12 + self->c12 * mT->c22;
	r.r22 = self->c20 * mT->c02 + self->c21 * mT->c12 + self->c22 * mT->c22;

	matrix3_set(self, &r); /* overwrite/save it */

	return self;
}